

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

void Aig_ManChoiceEval(Aig_Man_t *p)

{
  ulong uVar1;
  Aig_Obj_t **ppAVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  int i;
  Aig_Obj_t *pAVar6;
  
  p_00 = Vec_PtrAlloc(100);
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if ((((pAVar4 != (Aig_Obj_t *)0x0) &&
         (uVar1 = *(ulong *)&pAVar4->field_0x18, 0xfffffffd < ((uint)uVar1 & 7) - 7)) &&
        (ppAVar2 = p->pEquivs, ppAVar2 != (Aig_Obj_t **)0x0)) &&
       (((uVar1 & 0xffffffc0) != 0 && (ppAVar2[pAVar4->Id] != (Aig_Obj_t *)0x0)))) {
      uVar5 = 0;
      for (pAVar6 = pAVar4; pAVar6 != (Aig_Obj_t *)0x0; pAVar6 = ppAVar2[pAVar6->Id]) {
        uVar5 = (ulong)((int)uVar5 + 1);
      }
      printf("Choice node = %5d. Level = %2d. Choices = %d. { ",(long)pAVar4->Id,
             (ulong)((uint)(uVar1 >> 0x20) & 0xffffff),uVar5);
      while (pAVar6 = pAVar4, pAVar6 != (Aig_Obj_t *)0x0) {
        uVar3 = Aig_NodeMffcSupp(p,pAVar6,0,p_00);
        printf("S=%d N=%d L=%d  ",(ulong)(uint)p_00->nSize,(ulong)uVar3,
               (ulong)(*(uint *)&pAVar6->field_0x1c & 0xffffff));
        pAVar4 = (Aig_Obj_t *)0x0;
        if (p->pEquivs != (Aig_Obj_t **)0x0) {
          pAVar4 = p->pEquivs[pAVar6->Id];
        }
      }
      puts("}");
    }
  }
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Aig_ManChoiceEval( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupp;
    Aig_Obj_t * pNode, * pTemp;
    int i, Counter;

    vSupp = Vec_PtrAlloc( 100 );
    Aig_ManForEachNode( p, pNode, i )
    {
        if ( !Aig_ObjIsChoice(p, pNode) )
            continue; 
        Counter = 0;
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
            Counter++;
        printf( "Choice node = %5d. Level = %2d. Choices = %d. { ", pNode->Id, pNode->Level, Counter );
        for ( pTemp = pNode; pTemp; pTemp = Aig_ObjEquiv(p, pTemp) )
        {
            Counter = Aig_NodeMffcSupp( p, pTemp, 0, vSupp );
            printf( "S=%d N=%d L=%d  ", Vec_PtrSize(vSupp), Counter, pTemp->Level );
        }
        printf( "}\n" );
    }
    Vec_PtrFree( vSupp );
}